

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O0

int callback_dumb_increment(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  long lVar1;
  lws *wsi_00;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  size_t len_00;
  X509_STORE *v;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  ulong uVar5;
  char *local_650;
  char local_638 [8];
  char errbuf [256];
  X509_VERIFY_PARAM *param;
  int n_1;
  X509_LOOKUP *lookup;
  X509_STORE *store;
  uchar *end;
  uchar **p;
  char *pcStack_500;
  int lenx;
  char *px;
  char buffer [1040];
  uint local_dc;
  int n;
  char buf [66];
  char which_wsi [10];
  char *which;
  lws_tls_cert_info_results ci;
  size_t len_local;
  void *in_local;
  void *user_local;
  lws *plStack_18;
  lws_callback_reasons reason_local;
  lws *wsi_local;
  
  which_wsi._2_8_ = anon_var_dwarf_b6;
  ci._64_8_ = len;
  len_local = (size_t)in;
  in_local = user;
  user_local._4_4_ = reason;
  plStack_18 = wsi;
  switch(reason) {
  case LWS_CALLBACK_CLIENT_CONNECTION_ERROR:
    if (wsi == wsi_dumb) {
      which_wsi._2_8_ = anon_var_dwarf_75d;
      wsi_dumb = (lws *)0x0;
    }
    if (wsi == wsi_mirror) {
      which_wsi._2_8_ = (long)"nomirror" + 2;
      wsi_mirror = (lws *)0x0;
    }
    for (local_dc = 0; (int)local_dc < 3; local_dc = local_dc + 1) {
      if (plStack_18 == wsi_multi[(int)local_dc]) {
        sprintf(buf + 0x3e,"multi %d",(ulong)local_dc);
        which_wsi._2_8_ = buf + 0x3e;
        wsi_multi[(int)local_dc] = (lws *)0x0;
      }
    }
    if (len_local == 0) {
      local_650 = "(null)";
    }
    else {
      local_650 = (char *)len_local;
    }
    _lws_log(1,"CLIENT_CONNECTION_ERROR: %s: %s\n",which_wsi._2_8_,local_650);
    break;
  default:
    break;
  case LWS_CALLBACK_CLIENT_ESTABLISHED:
    _lws_log(8,"dumb: LWS_CALLBACK_CLIENT_ESTABLISHED\n");
    break;
  case LWS_CALLBACK_CLOSED:
    _lws_log(4,"dumb: LWS_CALLBACK_CLOSED\n");
    wsi_dumb = (lws *)0x0;
    break;
  case LWS_CALLBACK_CLIENT_RECEIVE:
    *(undefined1 *)((long)in + len) = 0;
    _lws_log(8,"rx %d \'%s\'\n",len & 0xffffffff,in);
    break;
  case LWS_CALLBACK_CLIENT_WRITEABLE:
    _lws_log(8,"Client wsi %p writable\n",wsi);
    break;
  case LWS_CALLBACK_OPENSSL_LOAD_EXTRA_CLIENT_VERIFY_CERTS:
    if (crl_path[0] != '\0') {
      errbuf._248_8_ = X509_VERIFY_PARAM_new();
      X509_VERIFY_PARAM_set_flags((X509_VERIFY_PARAM *)errbuf._248_8_,4);
      SSL_CTX_set1_param((SSL_CTX *)in_local,(X509_VERIFY_PARAM *)errbuf._248_8_);
      v = SSL_CTX_get_cert_store((SSL_CTX *)in_local);
      m = X509_LOOKUP_file();
      ctx = X509_STORE_add_lookup(v,m);
      iVar3 = X509_load_cert_crl_file(ctx,crl_path,1);
      X509_VERIFY_PARAM_free((X509_VERIFY_PARAM *)errbuf._248_8_);
      if (iVar3 != 1) {
        uVar5 = ERR_get_error();
        pcVar4 = ERR_error_string((long)(int)uVar5,local_638);
        _lws_log(1,"EXTRA_CLIENT_VERIFY_CERTS: SSL error: %s (%d)\n",pcVar4,uVar5 & 0xffffffff);
        return 1;
      }
    }
    break;
  case LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER:
    if (test_post != 0) {
      lVar1 = *in;
      iVar3 = lws_add_http_header_by_token
                        (wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH,(uchar *)"29",2,(uchar **)in,
                         (uchar *)(lVar1 + len));
      if (iVar3 != 0) {
        return -1;
      }
      iVar3 = lws_add_http_header_by_token
                        (plStack_18,WSI_TOKEN_HTTP_CONTENT_TYPE,
                         (uchar *)"application/x-www-form-urlencoded",0x21,(uchar **)in,
                         (uchar *)(lVar1 + len));
      if (iVar3 != 0) {
        return -1;
      }
      lws_client_http_body_pending(plStack_18,1);
      lws_callback_on_writable(plStack_18);
    }
    break;
  case LWS_CALLBACK_CLIENT_CONFIRM_EXTENSION_SUPPORTED:
    iVar3 = strcmp((char *)in,"deflate-stream");
    if ((iVar3 == 0) && (deny_deflate != 0)) {
      _lws_log(4,"denied deflate-stream extension\n");
      return 1;
    }
    iVar3 = strcmp((char *)len_local,"x-webkit-deflate-frame");
    if (iVar3 == 0) {
      return 1;
    }
    iVar3 = strcmp((char *)len_local,"deflate-frame");
    if (iVar3 == 0) {
      return 1;
    }
    break;
  case LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP:
    uVar2 = lws_http_client_http_response(wsi);
    _lws_log(4,"lws_http_client_http_response %d\n",(ulong)uVar2);
    iVar3 = lws_tls_peer_cert_info
                      (plStack_18,LWS_TLS_CERT_INFO_COMMON_NAME,(lws_tls_cert_info_results *)&which,
                       0x40);
    if (iVar3 == 0) {
      _lws_log(4," Peer Cert CN        : %s\n",(long)&which + 4);
    }
    iVar3 = lws_tls_peer_cert_info
                      (plStack_18,LWS_TLS_CERT_INFO_ISSUER_NAME,(lws_tls_cert_info_results *)&which,
                       0x40);
    if (iVar3 == 0) {
      _lws_log(4," Peer Cert issuer    : %s\n",(long)&which + 4);
    }
    iVar3 = lws_tls_peer_cert_info
                      (plStack_18,LWS_TLS_CERT_INFO_VALIDITY_FROM,
                       (lws_tls_cert_info_results *)&which,0);
    if (iVar3 == 0) {
      pcVar4 = ctime((time_t *)&which);
      _lws_log(4," Peer Cert Valid from: %s",pcVar4);
    }
    iVar3 = lws_tls_peer_cert_info
                      (plStack_18,LWS_TLS_CERT_INFO_VALIDITY_TO,(lws_tls_cert_info_results *)&which,
                       0);
    if (iVar3 == 0) {
      pcVar4 = ctime((time_t *)&which);
      _lws_log(4," Peer Cert Valid to  : %s",pcVar4);
    }
    iVar3 = lws_tls_peer_cert_info
                      (plStack_18,LWS_TLS_CERT_INFO_USAGE,(lws_tls_cert_info_results *)&which,0);
    if (iVar3 == 0) {
      _lws_log(4," Peer Cert usage bits: 0x%x\n",(ulong)(uint)which);
    }
    break;
  case LWS_CALLBACK_RECEIVE_CLIENT_HTTP:
    pcStack_500 = buffer + 8;
    p._4_4_ = 0x400;
    iVar3 = lws_http_client_read(wsi,&stack0xfffffffffffffb00,(int *)((long)&p + 4));
    if (iVar3 < 0) {
      return -1;
    }
    break;
  case LWS_CALLBACK_COMPLETED_CLIENT_HTTP:
    wsi_dumb = (lws *)0x0;
    force_exit = 1;
    break;
  case LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ:
    _lws_log(4,"LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ: %ld\n",len);
    show_http_content((char *)len_local,ci._64_8_);
    break;
  case LWS_CALLBACK_CLIENT_HTTP_WRITEABLE:
    strcpy(buf + 8,"text=hello&send=Send+the+form");
    wsi_00 = plStack_18;
    len_00 = strlen(buf + 8);
    iVar3 = lws_write(wsi_00,(uchar *)(buf + 8),len_00,LWS_WRITE_HTTP);
    if (iVar3 < 0) {
      return -1;
    }
    lws_client_http_body_pending(plStack_18,0);
  }
  return 0;
}

Assistant:

static int
callback_dumb_increment(struct lws *wsi, enum lws_callback_reasons reason,
			void *user, void *in, size_t len)
{
#if defined(LWS_WITH_TLS)
	union lws_tls_cert_info_results ci;
#endif
	const char *which = "http";
	char which_wsi[10], buf[50 + LWS_PRE];
	int n;

	switch (reason) {

	case LWS_CALLBACK_CLIENT_ESTABLISHED:
		lwsl_info("dumb: LWS_CALLBACK_CLIENT_ESTABLISHED\n");
		break;

	case LWS_CALLBACK_CLOSED:
		lwsl_notice("dumb: LWS_CALLBACK_CLOSED\n");
		wsi_dumb = NULL;
		break;

	case LWS_CALLBACK_CLIENT_RECEIVE:
		((char *)in)[len] = '\0';
		lwsl_info("rx %d '%s'\n", (int)len, (char *)in);
		break;

	/* because we are protocols[0] ... */

	case LWS_CALLBACK_CLIENT_CONNECTION_ERROR:
		if (wsi == wsi_dumb) {
			which = "dumb";
			wsi_dumb = NULL;
		}
		if (wsi == wsi_mirror) {
			which = "mirror";
			wsi_mirror = NULL;
		}

		for (n = 0; n < (int)LWS_ARRAY_SIZE(wsi_multi); n++)
			if (wsi == wsi_multi[n]) {
				sprintf(which_wsi, "multi %d", n);
				which = which_wsi;
				wsi_multi[n] = NULL;
			}

		lwsl_err("CLIENT_CONNECTION_ERROR: %s: %s\n", which,
			 in ? (char *)in : "(null)");
		break;

	case LWS_CALLBACK_CLIENT_CONFIRM_EXTENSION_SUPPORTED:
		if ((strcmp((const char *)in, "deflate-stream") == 0) &&
		    deny_deflate) {
			lwsl_notice("denied deflate-stream extension\n");
			return 1;
		}
		if ((strcmp((const char *)in, "x-webkit-deflate-frame") == 0))
			return 1;
		if ((strcmp((const char *)in, "deflate-frame") == 0))
			return 1;
		break;

	case LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP:
		lwsl_notice("lws_http_client_http_response %d\n",
				lws_http_client_http_response(wsi));
#if defined(LWS_WITH_TLS)
		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_COMMON_NAME,
					    &ci, sizeof(ci.ns.name)))
			lwsl_notice(" Peer Cert CN        : %s\n", ci.ns.name);

		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_ISSUER_NAME,
					    &ci, sizeof(ci.ns.name)))
			lwsl_notice(" Peer Cert issuer    : %s\n", ci.ns.name);

		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_VALIDITY_FROM,
					    &ci, 0))
			lwsl_notice(" Peer Cert Valid from: %s", ctime(&ci.time));

		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_VALIDITY_TO,
					    &ci, 0))
			lwsl_notice(" Peer Cert Valid to  : %s", ctime(&ci.time));
		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_USAGE,
					    &ci, 0))
			lwsl_notice(" Peer Cert usage bits: 0x%x\n", ci.usage);
#endif
		break;

	/* chunked content */
	case LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ:
		lwsl_notice("LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ: %ld\n",
			    (long)len);
		show_http_content(in, len);
		break;

	/* unchunked content */
	case LWS_CALLBACK_RECEIVE_CLIENT_HTTP:
		{
			char buffer[1024 + LWS_PRE];
			char *px = buffer + LWS_PRE;
			int lenx = sizeof(buffer) - LWS_PRE;

			/*
			 * Often you need to flow control this by something
			 * else being writable.  In that case call the api
			 * to get a callback when writable here, and do the
			 * pending client read in the writeable callback of
			 * the output.
			 *
			 * In the case of chunked content, this will call back
			 * LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ once per
			 * chunk or partial chunk in the buffer, and report
			 * zero length back here.
			 */
			if (lws_http_client_read(wsi, &px, &lenx) < 0)
				return -1;
		}
		break;

	case LWS_CALLBACK_CLIENT_WRITEABLE:
		lwsl_info("Client wsi %p writable\n", wsi);
		break;

	case LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER:
		if (test_post) {
			unsigned char **p = (unsigned char **)in, *end = (*p) + len;

			if (lws_add_http_header_by_token(wsi,
					WSI_TOKEN_HTTP_CONTENT_LENGTH,
					(unsigned char *)"29", 2, p, end))
				return -1;
			if (lws_add_http_header_by_token(wsi,
					WSI_TOKEN_HTTP_CONTENT_TYPE,
					(unsigned char *)"application/x-www-form-urlencoded",
					33, p, end))
				return -1;

			/* inform lws we have http body to send */
			lws_client_http_body_pending(wsi, 1);
			lws_callback_on_writable(wsi);
		}
		break;

	case LWS_CALLBACK_CLIENT_HTTP_WRITEABLE:
		strcpy(buf + LWS_PRE, "text=hello&send=Send+the+form");
		n = lws_write(wsi, (unsigned char *)&buf[LWS_PRE],
			      strlen(&buf[LWS_PRE]), LWS_WRITE_HTTP);
		if (n < 0)
			return -1;
		/* we only had one thing to send, so inform lws we are done
		 * if we had more to send, call lws_callback_on_writable(wsi);
		 * and just return 0 from callback.  On having sent the last
		 * part, call the below api instead.*/
		lws_client_http_body_pending(wsi, 0);
		break;

	case LWS_CALLBACK_COMPLETED_CLIENT_HTTP:
		wsi_dumb = NULL;
		force_exit = 1;
		break;

#if defined(LWS_WITH_TLS) && defined(LWS_HAVE_SSL_CTX_set1_param) && \
	!defined(LWS_WITH_MBEDTLS)
	case LWS_CALLBACK_OPENSSL_LOAD_EXTRA_CLIENT_VERIFY_CERTS:
		if (crl_path[0]) {
			/* Enable CRL checking of the server certificate */
			X509_STORE *store;
			X509_LOOKUP *lookup;
			int n;
			X509_VERIFY_PARAM *param = X509_VERIFY_PARAM_new();
			X509_VERIFY_PARAM_set_flags(param, X509_V_FLAG_CRL_CHECK);
			SSL_CTX_set1_param((SSL_CTX*)user, param);
			store = SSL_CTX_get_cert_store((SSL_CTX*)user);
			lookup = X509_STORE_add_lookup(store,
							X509_LOOKUP_file());
			n = X509_load_cert_crl_file(lookup, crl_path,
							X509_FILETYPE_PEM);
			X509_VERIFY_PARAM_free(param);
			if (n != 1) {
				char errbuf[256];
				n = ERR_get_error();
				lwsl_err("EXTRA_CLIENT_VERIFY_CERTS: "
					 "SSL error: %s (%d)\n",
					 ERR_error_string(n, errbuf), n);
				return 1;
			}
		}
		break;
#endif

	default:
		break;
	}

	return 0;
}